

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabwidget.cpp
# Opt level: O0

int __thiscall QTabWidget::heightForWidth(QTabWidget *this,int width)

{
  bool bVar1;
  int iVar2;
  undefined4 uVar3;
  int iVar4;
  QTabWidgetPrivate *pQVar5;
  QStyle *pQVar6;
  int *piVar7;
  int in_ESI;
  QSize *in_RDI;
  long in_FS_OFFSET;
  int stackHeight;
  int stackWidth;
  int contentsWidth;
  bool tabIsHorizontal;
  QTabWidget *that;
  QTabWidgetPrivate *d;
  QSize contentSize;
  QSize s;
  QSize t;
  QSize rc;
  QSize lc;
  QSize padding;
  QSize zero;
  QStyleOptionTabWidgetFrame opt;
  int in_stack_fffffffffffffe88;
  StateFlag in_stack_fffffffffffffe8c;
  QTabWidgetPrivate *in_stack_fffffffffffffe90;
  QSize *in_stack_fffffffffffffe98;
  QSize *pQVar8;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  undefined4 in_stack_fffffffffffffeac;
  undefined4 uVar9;
  undefined4 in_stack_fffffffffffffec4;
  uint uVar10;
  undefined8 in_stack_fffffffffffffec8;
  undefined1 horizontal;
  QSize local_108;
  int local_100;
  int local_fc;
  int local_f8;
  undefined8 local_f4;
  QSize local_ec;
  QSize local_dc;
  undefined8 local_d4;
  QSize local_cc;
  undefined1 *local_c4;
  undefined1 *local_bc;
  undefined1 *local_b4;
  undefined1 *local_ac;
  undefined1 *local_a4;
  undefined1 *local_9c;
  undefined4 local_94;
  undefined1 local_90 [8];
  undefined4 local_88;
  long local_8;
  
  horizontal = (undefined1)((ulong)in_stack_fffffffffffffec8 >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = d_func((QTabWidget *)0x6e7a64);
  memset(local_90,0xaa,0x88);
  QStyleOptionTabWidgetFrame::QStyleOptionTabWidgetFrame((QStyleOptionTabWidgetFrame *)0x6e7a8d);
  (**(code **)((long)*in_RDI + 0x1b0))(in_RDI,local_90);
  QFlags<QStyle::StateFlag>::QFlags
            ((QFlags<QStyle::StateFlag> *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
  local_88 = local_94;
  local_9c = &DAT_aaaaaaaaaaaaaaaa;
  QSize::QSize((QSize *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
               in_stack_fffffffffffffe88);
  local_a4 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar6 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  local_a4 = (undefined1 *)
             (**(code **)(*(long *)pQVar6 + 0xe8))(pQVar6,0x11,local_90,&local_9c,in_RDI);
  local_ac = &DAT_aaaaaaaaaaaaaaaa;
  QSize::QSize((QSize *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
               in_stack_fffffffffffffe88);
  local_b4 = &DAT_aaaaaaaaaaaaaaaa;
  QSize::QSize((QSize *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
               in_stack_fffffffffffffe88);
  if ((pQVar5->leftCornerWidget != (QWidget *)0x0) &&
     (bVar1 = QWidget::isVisible((QWidget *)0x6e7b87), bVar1)) {
    local_bc = (undefined1 *)(**(code **)(*(long *)pQVar5->leftCornerWidget + 0x70))();
    local_ac = local_bc;
  }
  if ((pQVar5->rightCornerWidget != (QWidget *)0x0) &&
     (bVar1 = QWidget::isVisible((QWidget *)0x6e7bd7), bVar1)) {
    local_c4 = (undefined1 *)(**(code **)(*(long *)pQVar5->rightCornerWidget + 0x70))();
    local_b4 = local_c4;
  }
  if ((pQVar5->dirty & 1U) == 0) {
    pQVar8 = in_RDI;
    setUpLayout((QTabWidget *)in_stack_fffffffffffffe98,
                SUB81((ulong)in_stack_fffffffffffffe90 >> 0x38,0));
    horizontal = (undefined1)((ulong)pQVar8 >> 0x38);
  }
  local_cc = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  QSize::QSize((QSize *)in_stack_fffffffffffffe90);
  bVar1 = QTabWidgetPrivate::isAutoHidden(in_stack_fffffffffffffe90);
  if (!bVar1) {
    local_d4 = (**(code **)(*(long *)&pQVar5->tabs->super_QWidget + 0x70))();
    local_cc = (QSize)local_d4;
    bVar1 = usesScrollButtons((QTabWidget *)0x6e7c90);
    if (bVar1) {
      QSize::QSize((QSize *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
                   in_stack_fffffffffffffe88);
      local_dc = QSize::boundedTo(in_stack_fffffffffffffe98,(QSize *)in_stack_fffffffffffffe90);
      local_cc = local_dc;
    }
    else {
      QGuiApplication::primaryScreen();
      local_f4 = QScreen::virtualSize();
      local_ec = QSize::boundedTo(in_stack_fffffffffffffe98,(QSize *)in_stack_fffffffffffffe90);
      local_cc = local_ec;
    }
  }
  uVar9 = CONCAT13(1,(int3)in_stack_fffffffffffffeac);
  if (pQVar5->pos != North) {
    uVar9 = CONCAT13(pQVar5->pos == South,(int3)in_stack_fffffffffffffeac);
  }
  uVar10 = CONCAT13((char)((uint)uVar9 >> 0x18),(int3)in_stack_fffffffffffffec4);
  iVar2 = QSize::width((QSize *)0x6e7d63);
  iVar2 = in_ESI - iVar2;
  iVar4 = iVar2;
  if ((uVar10 & 0x1000000) == 0) {
    local_f8 = QSize::width((QSize *)0x6e7d8b);
    local_fc = QSize::width((QSize *)0x6e7d9f);
    local_100 = QSize::width((QSize *)0x6e7db0);
    piVar7 = qMax<int>(&local_fc,&local_100);
    piVar7 = qMax<int>(&local_f8,piVar7);
    iVar2 = iVar2 - *piVar7;
  }
  uVar3 = (**(code **)(*(long *)&(pQVar5->stack->super_QFrame).super_QWidget + 0x80))
                    (pQVar5->stack,iVar2);
  local_108 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  pQVar8 = &local_108;
  QSize::QSize((QSize *)&DAT_aaaaaaaaaaaaaaaa,in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88);
  basicSize((bool)horizontal,(QSize *)CONCAT44(uVar10,iVar4),(QSize *)CONCAT44(iVar2,uVar3),in_RDI,
            (QSize *)CONCAT44(uVar9,in_ESI));
  ::operator+((QSize *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),pQVar8);
  iVar4 = QSize::height((QSize *)0x6e7e84);
  QStyleOptionTabWidgetFrame::~QStyleOptionTabWidgetFrame((QStyleOptionTabWidgetFrame *)0x6e7e95);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return iVar4;
}

Assistant:

int QTabWidget::heightForWidth(int width) const
{
    Q_D(const QTabWidget);
    QStyleOptionTabWidgetFrame opt;
    initStyleOption(&opt);
    opt.state = QStyle::State_None;

    QSize zero(0,0);
    const QSize padding = style()->sizeFromContents(QStyle::CT_TabWidget, &opt, zero, this);

    QSize lc(0, 0), rc(0, 0);
    if (d->leftCornerWidget && d->leftCornerWidget->isVisible())
        lc = d->leftCornerWidget->sizeHint();
    if (d->rightCornerWidget && d->rightCornerWidget->isVisible())
        rc = d->rightCornerWidget->sizeHint();
    if (!d->dirty) {
        QTabWidget *that = const_cast<QTabWidget*>(this);
        that->setUpLayout(true);
    }
    QSize t;
    if (!d->isAutoHidden()) {
        t = d->tabs->sizeHint();
        if (usesScrollButtons())
            t = t.boundedTo(QSize(200,200));
        else
            t = t.boundedTo(QGuiApplication::primaryScreen()->virtualSize());
    }

    const bool tabIsHorizontal = (d->pos == North || d->pos == South);
    const int contentsWidth = width - padding.width();
    int stackWidth = contentsWidth;
    if (!tabIsHorizontal)
        stackWidth -= qMax(t.width(), qMax(lc.width(), rc.width()));

    int stackHeight = d->stack->heightForWidth(stackWidth);
    QSize s(stackWidth, stackHeight);

    QSize contentSize = basicSize(tabIsHorizontal, lc, rc, s, t);
    return (contentSize + padding).height();
}